

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall BenevolentBotStrategy::numArmies(BenevolentBotStrategy *this)

{
  bool bVar1;
  Hand *this_00;
  vector<CardType,_std::allocator<CardType>_> *this_01;
  reference pCVar2;
  iterator iStack_30;
  CardType cardType;
  iterator __end1;
  iterator __begin1;
  vector<CardType,_std::allocator<CardType>_> *__range1;
  int count;
  BenevolentBotStrategy *this_local;
  
  __range1._4_4_ = 0;
  this_00 = Player::getCards((this->super_PlayerStrategy).player);
  this_01 = Hand::getHand(this_00);
  __end1 = std::vector<CardType,_std::allocator<CardType>_>::begin(this_01);
  iStack_30 = std::vector<CardType,_std::allocator<CardType>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>::
             operator*(&__end1);
    if (*pCVar2 == *(this->super_PlayerStrategy).exchangingCardType) {
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    __gnu_cxx::__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>::
    operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

int BenevolentBotStrategy::numArmies() {
    int count = 0;
    for (auto cardType : *player->getCards()->getHand()) {
        if ((int) cardType == *exchangingCardType) {
            count++;
        }
    }
    return count;
}